

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regalloc.cpp
# Opt level: O3

Error __thiscall asmjit::RAPass::compile(RAPass *this,CCFunc *func)

{
  Error EVar1;
  
  EVar1 = (*(this->super_CBPass)._vptr_CBPass[4])();
  if (EVar1 == 0) {
    EVar1 = (*(this->super_CBPass)._vptr_CBPass[0xb])(this);
    if ((((EVar1 == 0) && (EVar1 = (*(this->super_CBPass)._vptr_CBPass[0xc])(this), EVar1 == 0)) &&
        (EVar1 = (*(this->super_CBPass)._vptr_CBPass[0xd])(this), EVar1 == 0)) &&
       ((((((this->super_CBPass)._cb)->super_CodeEmitter)._globalOptions & 4) == 0 ||
        (EVar1 = (*(this->super_CBPass)._vptr_CBPass[0xe])(this), EVar1 == 0)))) {
      EVar1 = (*(this->super_CBPass)._vptr_CBPass[0x10])(this);
    }
    (*(this->super_CBPass)._vptr_CBPass[5])(this);
    ((this->super_CBPass)._cb)->_cursor = (CBNode *)0x0;
    return EVar1;
  }
  return EVar1;
}

Assistant:

Error RAPass::compile(CCFunc* func) noexcept {
  ASMJIT_PROPAGATE(prepare(func));

  Error err;
  do {
    err = fetch();
    if (err) break;

    err = removeUnreachableCode();
    if (err) break;

    err = livenessAnalysis();
    if (err) break;

#if !defined(ASMJIT_DISABLE_LOGGING)
    if (cc()->getGlobalOptions() & CodeEmitter::kOptionLoggingEnabled) {
      err = annotate();
      if (err) break;
    }
#endif // !ASMJIT_DISABLE_LOGGING

    err = translate();
  } while (false);

  cleanup();

  // We alter the compiler cursor, because it doesn't make sense to reference
  // it after compilation - some nodes may disappear and it's forbidden to add
  // new code after the compilation is done.
  cc()->_setCursor(nullptr);
  return err;
}